

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O2

int __thiscall
ncnn::Gemm::forward_int8
          (Gemm *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  void *pvVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar7;
  int i_3;
  long lVar8;
  long lVar9;
  size_t *psVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  pointer pMVar14;
  int i_2;
  Mat *pMVar15;
  uint uVar16;
  ulong uVar17;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar18;
  ulong uVar19;
  pointer pMVar20;
  ulong uVar21;
  float *pfVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  int *piVar26;
  int j;
  uint uVar27;
  void *pvVar28;
  size_t sVar29;
  void *pvVar30;
  Allocator **ppAVar31;
  int i_1;
  int sum;
  int iVar32;
  Mat *pMVar33;
  long lVar34;
  float *pfVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  Allocator *local_240;
  Mat local_228;
  Mat local_1d8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_188;
  int local_17c;
  Mat local_178;
  Mat local_130;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  size_t *local_d0;
  int *local_c8;
  void *local_c0;
  long local_b8;
  long local_b0;
  Mat *local_a8;
  Mat local_a0;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if (this->constantA == 0) {
    pMVar15 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (this->constantB != 0) goto LAB_00425681;
    pMVar33 = pMVar15 + 1;
  }
  else {
    pMVar15 = &this->A_data;
    if (this->constantB == 0) {
      pMVar33 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    else {
LAB_00425681:
      pMVar33 = &this->B_data;
    }
  }
  local_228.cstep = 0;
  local_228.data = (void *)0x0;
  local_228.refcount._0_4_ = 0;
  local_228.refcount._4_4_ = 0;
  local_228.elemsize._0_4_ = 0;
  local_228.elemsize._4_4_ = 0;
  local_228.elempack = 0;
  local_228.allocator = (Allocator *)0x0;
  local_228.dims = 0;
  local_228.w = 0;
  local_228.h = 0;
  local_228.d = 0;
  local_228.c = 0;
  local_188 = top_blobs;
  if (this->transA == 0) {
    if (&local_228 == pMVar15) {
      local_130.w = 0;
      local_130.h = 0;
    }
    else {
      piVar26 = pMVar15->refcount;
      if (piVar26 != (int *)0x0) {
        LOCK();
        *piVar26 = *piVar26 + 1;
        UNLOCK();
      }
      local_228.data = pMVar15->data;
      local_228.refcount._0_4_ = SUB84(pMVar15->refcount,0);
      local_228.refcount._4_4_ = (undefined4)((ulong)pMVar15->refcount >> 0x20);
      local_228.elemsize._0_4_ = (undefined4)pMVar15->elemsize;
      local_228.elemsize._4_4_ = (undefined4)(pMVar15->elemsize >> 0x20);
      local_228.elempack = pMVar15->elempack;
      local_228.allocator = pMVar15->allocator;
      uVar3 = pMVar15->dims;
      uVar4 = pMVar15->w;
      uVar5 = pMVar15->h;
      uVar6 = pMVar15->d;
      local_228.w = uVar4;
      local_228.h = uVar5;
      local_228.d = uVar6;
      local_228.c = pMVar15->c;
      local_228.cstep = pMVar15->cstep;
      local_130.w = pMVar15->w;
      local_130.h = pMVar15->h;
      local_228.dims = uVar3;
    }
  }
  else if (pMVar15->elemsize == 1) {
    Mat::create(&local_228,pMVar15->h,pMVar15->w,1,1,opt->workspace_allocator);
    for (lVar9 = 0; local_130.w = local_228.w, local_130.h = local_228.h, lVar9 < local_228.h;
        lVar9 = lVar9 + 1) {
      uVar17 = (ulong)local_228.w;
      lVar8 = CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize) * lVar9 * uVar17;
      for (lVar13 = 0; lVar13 < (int)uVar17; lVar13 = lVar13 + 1) {
        *(undefined1 *)((long)local_228.data + lVar13 + lVar8) =
             *(undefined1 *)((long)pMVar15->data + lVar9 + pMVar15->w * lVar13 * pMVar15->elemsize);
        uVar17 = (ulong)(uint)local_228.w;
      }
    }
  }
  else {
    Mat::create(&local_228,(&pMVar15->h)[(ulong)(pMVar15->dims == 3) * 2],pMVar15->w,4,1,
                opt->workspace_allocator);
    uVar17 = 0;
    uVar25 = 0;
    if (0 < local_228.w) {
      uVar25 = (ulong)(uint)local_228.w;
    }
    uVar19 = 0;
    pvVar28 = local_228.data;
    if (0 < local_228.h) {
      uVar19 = (ulong)(uint)local_228.h;
    }
    for (; local_130.w = local_228.w, local_130.h = local_228.h, uVar17 != uVar19;
        uVar17 = uVar17 + 1) {
      for (uVar21 = 0; uVar25 != uVar21; uVar21 = uVar21 + 1) {
        if (pMVar15->dims == 3) {
          sVar29 = pMVar15->cstep;
        }
        else {
          sVar29 = (size_t)pMVar15->w;
        }
        *(undefined4 *)((long)pvVar28 + uVar21 * 4) =
             *(undefined4 *)((long)pMVar15->data + uVar17 * 4 + sVar29 * uVar21 * pMVar15->elemsize)
        ;
      }
      pvVar28 = (void *)((long)pvVar28 +
                        (long)local_228.w *
                        CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize));
    }
  }
  local_130.refcount = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
  local_130.data = local_228.data;
  local_130.elemsize = CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize);
  local_130.elempack = local_228.elempack;
  local_130.allocator = local_228.allocator;
  local_130.dims = local_228.dims;
  local_130.c = local_228.c;
  local_130.d = local_228.d;
  local_130.cstep = local_228.cstep;
  if (local_130.refcount != (int *)0x0) {
    LOCK();
    *local_130.refcount = *local_130.refcount + 1;
    UNLOCK();
  }
  local_a0.data = (this->A_data_int8_scales).data;
  local_a0.refcount = (this->A_data_int8_scales).refcount;
  local_a0.elemsize = (this->A_data_int8_scales).elemsize;
  local_a0.elempack = (this->A_data_int8_scales).elempack;
  local_a0.allocator = (this->A_data_int8_scales).allocator;
  local_a0.dims = (this->A_data_int8_scales).dims;
  local_a0.w = (this->A_data_int8_scales).w;
  local_a0.h = (this->A_data_int8_scales).h;
  local_a0.d = (this->A_data_int8_scales).d;
  local_a0.c = (this->A_data_int8_scales).c;
  local_a0.cstep = (this->A_data_int8_scales).cstep;
  if (local_a0.refcount != (int *)0x0) {
    LOCK();
    *local_a0.refcount = *local_a0.refcount + 1;
    UNLOCK();
  }
  if (local_130.elemsize != 1) {
    Mat::create(&local_130,local_228.w,(&local_228.h)[(ulong)(local_228.dims == 3) * 2],1,1,
                opt->workspace_allocator);
    Mat::create(&local_a0,local_130.h,4,1,opt->workspace_allocator);
    for (lVar9 = 0; pvVar2 = local_130.data, pvVar28 = local_228.data, lVar9 < local_130.h;
        lVar9 = lVar9 + 1) {
      psVar10 = (size_t *)&local_228.w;
      if (local_228.dims == 3) {
        psVar10 = &local_228.cstep;
      }
      lVar8 = (long)local_130.w;
      uVar17 = 0;
      if (0 < local_130.w) {
        uVar17 = (ulong)(uint)local_130.w;
      }
      iVar11 = (int)*psVar10 * (int)lVar9;
      fVar36 = 0.0;
      for (uVar25 = 0; uVar17 != uVar25; uVar25 = uVar25 + 1) {
        fVar37 = ABS(*(float *)((long)local_228.data + uVar25 * 4 + (long)iVar11 * 4));
        if (fVar36 <= fVar37) {
          fVar36 = fVar37;
        }
      }
      fVar36 = (float)(-(uint)(fVar36 == 0.0) & 0x3f800000 |
                      ~-(uint)(fVar36 == 0.0) & (uint)(127.0 / fVar36));
      *(float *)((long)local_a0.data + lVar9 * 4) = fVar36;
      lVar13 = local_130.elemsize * lVar9;
      local_e8 = ZEXT416((uint)fVar36);
      for (lVar34 = 0; lVar34 < local_130.w; lVar34 = lVar34 + 1) {
        fVar36 = roundf(*(float *)((long)pvVar28 + lVar34 * 4 + (long)iVar11 * 4) * fVar36);
        iVar32 = (int)fVar36;
        if (iVar32 < -0x7e) {
          iVar32 = -0x7f;
        }
        if (0x7e < iVar32) {
          iVar32 = 0x7f;
        }
        *(char *)((long)pvVar2 + lVar34 + lVar13 * lVar8) = (char)iVar32;
        fVar36 = (float)local_e8._0_4_;
      }
    }
  }
  local_1d8.data = pMVar33->data;
  local_1d8.refcount = pMVar33->refcount;
  local_1d8.elemsize = pMVar33->elemsize;
  local_1d8.elempack = pMVar33->elempack;
  local_1d8.allocator = pMVar33->allocator;
  local_1d8.dims = pMVar33->dims;
  local_1d8.w = pMVar33->w;
  local_1d8.h = pMVar33->h;
  local_1d8.d = pMVar33->d;
  local_1d8.c = pMVar33->c;
  local_1d8.cstep = pMVar33->cstep;
  if (local_1d8.refcount != (int *)0x0) {
    LOCK();
    *local_1d8.refcount = *local_1d8.refcount + 1;
    UNLOCK();
  }
  if (local_1d8.elemsize == 1) {
    local_e8 = ZEXT416((uint)this->B_data_int8_scale);
  }
  else {
    Mat::create(&local_1d8,pMVar33->w,(&pMVar33->h)[(ulong)(pMVar33->dims == 3) * 2],1,1,
                opt->workspace_allocator);
    iVar11 = 0;
    uVar17 = 0;
    if (0 < local_1d8.w) {
      uVar17 = (ulong)(uint)local_1d8.w;
    }
    iVar32 = 0;
    if (0 < local_1d8.h) {
      iVar32 = local_1d8.h;
    }
    fVar36 = 0.0;
    for (; iVar11 != iVar32; iVar11 = iVar11 + 1) {
      if (pMVar33->dims == 3) {
        iVar23 = (int)pMVar33->cstep;
      }
      else {
        iVar23 = pMVar33->w;
      }
      for (uVar25 = 0; uVar17 != uVar25; uVar25 = uVar25 + 1) {
        fVar37 = ABS(*(float *)((long)pMVar33->data + uVar25 * 4 + (long)(iVar23 * iVar11) * 4));
        if (fVar36 <= fVar37) {
          fVar36 = fVar37;
        }
      }
    }
    local_e8 = ZEXT416(-(uint)(fVar36 == 0.0) & 0x3f800000 |
                       ~-(uint)(fVar36 == 0.0) & (uint)(127.0 / fVar36));
    uVar24 = local_1d8.w;
    for (lVar9 = 0; pvVar28 = local_1d8.data, lVar9 < local_1d8.h; lVar9 = lVar9 + 1) {
      if (pMVar33->dims == 3) {
        iVar11 = (int)pMVar33->cstep;
      }
      else {
        iVar11 = pMVar33->w;
      }
      lVar8 = (long)(int)uVar24;
      lVar34 = local_1d8.elemsize * lVar9;
      pvVar2 = pMVar33->data;
      for (lVar13 = 0; lVar13 < (int)uVar24; lVar13 = lVar13 + 1) {
        fVar36 = roundf(*(float *)((long)pvVar2 + lVar13 * 4 + (long)((int)lVar9 * iVar11) * 4) *
                        (float)local_e8._0_4_);
        iVar32 = (int)fVar36;
        if (iVar32 < -0x7e) {
          iVar32 = -0x7f;
        }
        if (0x7e < iVar32) {
          iVar32 = 0x7f;
        }
        *(char *)((long)pvVar28 + lVar13 + lVar34 * lVar8) = (char)iVar32;
        uVar24 = local_1d8.w;
      }
    }
  }
  local_178.cstep = 0;
  local_178.data = (void *)0x0;
  local_178.refcount._0_4_ = 0;
  local_178.refcount._4_4_ = 0;
  local_178.elemsize._0_4_ = 0;
  local_178.elemsize._4_4_ = 0;
  local_178.elempack = 0;
  local_178.allocator = (Allocator *)0x0;
  local_178.dims = 0;
  local_178.w = 0;
  local_178.h = 0;
  local_178.d = 0;
  local_178.c = 0;
  if (this->transB == 0) {
    Mat::create(&local_178,local_1d8.h,local_1d8.w,1,1,opt->workspace_allocator);
    for (lVar9 = 0; lVar9 < local_178.h; lVar9 = lVar9 + 1) {
      uVar17 = (ulong)local_178.w;
      lVar8 = CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize) * lVar9 * uVar17;
      for (lVar13 = 0; lVar13 < (int)uVar17; lVar13 = lVar13 + 1) {
        *(undefined1 *)((long)local_178.data + lVar13 + lVar8) =
             *(undefined1 *)
              ((long)local_1d8.data + lVar9 + local_1d8.w * lVar13 * local_1d8.elemsize);
        uVar17 = (ulong)(uint)local_178.w;
      }
    }
  }
  else {
    if (local_1d8.refcount != (int *)0x0) {
      LOCK();
      *local_1d8.refcount = *local_1d8.refcount + 1;
      UNLOCK();
    }
    local_178.data = local_1d8.data;
    local_178.refcount._0_4_ = SUB84(local_1d8.refcount,0);
    local_178.refcount._4_4_ = (undefined4)((ulong)local_1d8.refcount >> 0x20);
    local_178.elemsize._0_4_ = (undefined4)local_1d8.elemsize;
    local_178.elemsize._4_4_ = (undefined4)(local_1d8.elemsize >> 0x20);
    local_178.elempack = local_1d8.elempack;
    local_178.allocator = local_1d8.allocator;
    local_178.dims = local_1d8.dims;
    local_178.d = local_1d8.d;
    local_178.c = local_1d8.c;
    local_178.cstep = local_1d8.cstep;
    local_178.w = local_1d8.w;
    local_178.h = local_1d8.h;
  }
  if (this->constantC != 0) {
    piVar26 = (this->C_data).refcount;
    if (piVar26 != (int *)0x0) {
      LOCK();
      *piVar26 = *piVar26 + 1;
      UNLOCK();
    }
    local_48._0_8_ = (this->C_data).data;
    local_48._8_8_ = (this->C_data).refcount;
    local_240 = (this->C_data).allocator;
    uVar24 = this->constant_broadcast_type_C;
    goto LAB_00425f0c;
  }
  if (this->constantB == 0 || this->constantA == 0) {
    pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pMVar14 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if (this->constantA != 0 || this->constantB != 0) {
LAB_00426293:
      if ((long)pMVar14 - (long)pMVar20 == 0x90) {
        piVar26 = pMVar20[1].refcount;
        if (piVar26 != (int *)0x0) {
          LOCK();
          *piVar26 = *piVar26 + 1;
          UNLOCK();
        }
        pvVar28 = pMVar20[1].data;
        local_48._0_8_ = pMVar20[1].data;
        local_48._8_8_ = pMVar20[1].refcount;
        ppAVar31 = &pMVar20[1].allocator;
        piVar26 = &pMVar20[1].c;
        psVar10 = &pMVar20[1].cstep;
        iVar11 = pMVar20[1].dims;
        uVar12 = pMVar20[1].w;
        uVar16 = pMVar20[1].h;
        goto LAB_00426327;
      }
    }
    if ((long)pMVar14 - (long)pMVar20 != 0xd8) {
      local_240 = (Allocator *)0x0;
      local_48 = ZEXT816(0);
      uVar24 = 0;
      goto LAB_00425f0c;
    }
    piVar26 = pMVar20[2].refcount;
    if (piVar26 != (int *)0x0) {
      LOCK();
      *piVar26 = *piVar26 + 1;
      UNLOCK();
    }
    pvVar28 = pMVar20[2].data;
    local_48._0_8_ = pMVar20[2].data;
    local_48._8_8_ = pMVar20[2].refcount;
    ppAVar31 = &pMVar20[2].allocator;
    piVar26 = &pMVar20[2].c;
    psVar10 = &pMVar20[2].cstep;
    iVar11 = pMVar20[2].dims;
    uVar12 = pMVar20[2].w;
    uVar16 = pMVar20[2].h;
  }
  else {
    pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pMVar14 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if ((long)pMVar14 - (long)pMVar20 != 0x48) goto LAB_00426293;
    piVar26 = pMVar20->refcount;
    if (piVar26 != (int *)0x0) {
      LOCK();
      *piVar26 = *piVar26 + 1;
      UNLOCK();
    }
    pvVar28 = pMVar20->data;
    local_48._0_8_ = pMVar20->data;
    local_48._8_8_ = pMVar20->refcount;
    ppAVar31 = &pMVar20->allocator;
    piVar26 = &pMVar20->c;
    psVar10 = &pMVar20->cstep;
    iVar11 = pMVar20->dims;
    uVar12 = pMVar20->w;
    uVar16 = pMVar20->h;
  }
LAB_00426327:
  local_240 = *ppAVar31;
  uVar24 = 0;
  if ((pvVar28 != (void *)0x0) && ((long)*piVar26 * *psVar10 != 0)) {
    uVar24 = (uint)(uVar12 == local_130.h && iVar11 == 1);
    uVar27 = uVar24;
    if (uVar12 == local_178.h) {
      uVar27 = 4;
    }
    if (iVar11 != 1) {
      uVar27 = uVar24;
    }
    uVar24 = 2;
    if (uVar16 != local_130.h) {
      uVar24 = uVar27;
    }
    if (uVar12 != 1) {
      uVar24 = uVar27;
    }
    if (iVar11 != 2) {
      uVar24 = uVar27;
    }
    uVar27 = 3;
    if (uVar16 != local_130.h) {
      uVar27 = uVar24;
    }
    if (uVar12 != local_178.h) {
      uVar27 = uVar24;
    }
    if ((iVar11 == 2) && (uVar24 = uVar27, uVar16 == 1 && uVar12 == local_178.h)) {
      uVar24 = 4;
    }
  }
LAB_00425f0c:
  uVar16 = local_178.h;
  uVar12 = local_130.h;
  if (this->output_transpose == 0) {
    uVar16 = local_130.h;
    uVar12 = local_178.h;
  }
  pMVar15 = (local_188->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pfVar35 = local_48._0_8_;
  local_58._8_4_ = local_48._8_4_;
  local_58._12_4_ = local_48._12_4_;
  local_58._0_8_ = local_48._8_8_;
  if (this->output_N1M == 0) {
    Mat::create(pMVar15,uVar12,uVar16,4,opt->blob_allocator);
  }
  else {
    Mat::create(pMVar15,uVar12,1,uVar16,4,opt->blob_allocator);
  }
  local_d8 = 0xffffffffffffff9c;
  if ((pMVar15->data != (void *)0x0) && ((long)pMVar15->c * pMVar15->cstep != 0)) {
    fVar36 = this->alpha;
    fVar37 = this->beta;
    iVar11 = this->output_transpose;
    local_b0 = (long)local_178.h;
    local_17c = pMVar15->dims;
    uVar17 = 0;
    if (0 < local_130.w) {
      uVar17 = (ulong)(uint)local_130.w;
    }
    uVar25 = 0;
    if (0 < local_178.h) {
      uVar25 = (ulong)(uint)local_178.h;
    }
    local_d8 = 0;
    uVar12 = local_130.h;
    if (local_130.h < 1) {
      uVar12 = 0;
    }
    local_c0 = local_a0.data;
    local_b8 = (long)local_130.w * local_130.elemsize;
    local_c8 = &pMVar15->w;
    local_d0 = &pMVar15->cstep;
    pvVar7 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)0x0;
    pvVar28 = local_130.data;
    while (pvVar18 = pvVar7, local_a8 = pMVar15,
          pvVar18 != (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(ulong)uVar12) {
      psVar10 = (size_t *)local_c8;
      if (local_17c == 3) {
        psVar10 = local_d0;
      }
      sVar29 = *psVar10;
      fVar1 = *(float *)((long)local_a0.data + (long)pvVar18 * 4);
      pvVar2 = pMVar15->data;
      pvVar30 = local_178.data;
      for (uVar19 = 0; uVar19 != uVar25; uVar19 = uVar19 + 1) {
        iVar32 = 0;
        for (uVar21 = 0; uVar17 != uVar21; uVar21 = uVar21 + 1) {
          iVar32 = iVar32 + (int)*(char *)((long)pvVar30 + uVar21) *
                            (int)*(char *)((long)pvVar28 + uVar21);
        }
        fVar38 = (float)iVar32 * (1.0 / (fVar1 * (float)local_e8._0_4_));
        if (pfVar35 != (float *)0x0) {
          pfVar22 = pfVar35;
          switch(uVar24) {
          case 0:
            break;
          case 1:
          case 2:
            pfVar22 = pfVar35 + (long)pvVar18;
            break;
          case 3:
            pfVar22 = pfVar35 + (long)pvVar18 * local_b0 + uVar19;
            break;
          case 4:
            pfVar22 = pfVar35 + uVar19;
            break;
          default:
            fVar39 = 0.0;
            goto LAB_004261ad;
          }
          fVar39 = *pfVar22;
LAB_004261ad:
          fVar38 = fVar38 + fVar39 * fVar37;
        }
        lVar9 = uVar19 * (long)(int)sVar29 * 4 + (long)pvVar18 * 4;
        if (iVar11 == 0) {
          lVar9 = uVar19 * 4 + (long)pvVar18 * (long)(int)sVar29 * 4;
        }
        *(float *)((long)pvVar2 + lVar9) = fVar38 * fVar36;
        pvVar30 = (void *)((long)pvVar30 +
                          (long)local_178.w *
                          CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize));
      }
      pvVar28 = (void *)((long)pvVar28 + local_b8);
      local_188 = pvVar18;
      pvVar7 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
               ((long)&(pvVar18->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                       super__Vector_impl_data._M_start + 1);
    }
  }
  if ((int *)local_58._0_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_58._0_8_ == 0) {
      if (local_240 == (Allocator *)0x0) {
        free((void *)local_48._0_8_);
      }
      else {
        (*local_240->_vptr_Allocator[3])();
      }
    }
  }
  piVar26 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
  if (piVar26 != (int *)0x0) {
    LOCK();
    *piVar26 = *piVar26 + -1;
    UNLOCK();
    if (*piVar26 == 0) {
      if (local_178.allocator == (Allocator *)0x0) {
        free(local_178.data);
      }
      else {
        (*(local_178.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_1d8.refcount != (int *)0x0) {
    LOCK();
    *local_1d8.refcount = *local_1d8.refcount + -1;
    UNLOCK();
    if (*local_1d8.refcount == 0) {
      if (local_1d8.allocator == (Allocator *)0x0) {
        free(local_1d8.data);
      }
      else {
        (*(local_1d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_a0.refcount != (int *)0x0) {
    LOCK();
    *local_a0.refcount = *local_a0.refcount + -1;
    UNLOCK();
    if (*local_a0.refcount == 0) {
      if (local_a0.allocator == (Allocator *)0x0) {
        free(local_a0.data);
      }
      else {
        (*(local_a0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_130.refcount != (int *)0x0) {
    LOCK();
    *local_130.refcount = *local_130.refcount + -1;
    UNLOCK();
    if (*local_130.refcount == 0) {
      if (local_130.allocator == (Allocator *)0x0) {
        free(local_130.data);
      }
      else {
        (*(local_130.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar26 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
  if (piVar26 != (int *)0x0) {
    LOCK();
    *piVar26 = *piVar26 + -1;
    UNLOCK();
    if (*piVar26 == 0) {
      if (local_228.allocator == (Allocator *)0x0) {
        free(local_228.data);
      }
      else {
        (*(local_228.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return (int)local_d8;
}

Assistant:

int Gemm::forward_int8(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& A0 = constantA ? A_data : bottom_blobs[0];
    const Mat& B0 = constantB ? B_data : constantA ? bottom_blobs[0] : bottom_blobs[1];

    Mat A;
    if (transA == 0)
    {
        A = A0;
    }
    else
    {
        // transpose A to row-major
        if (A0.elemsize == 1)
        {
            A.create(A0.h, A0.w, (size_t)1u, 1, opt.workspace_allocator);

            for (int i = 0; i < A.h; i++)
            {
                signed char* ptr = A.row<signed char>(i);
                for (int j = 0; j < A.w; j++)
                {
                    ptr[j] = A0.row<const signed char>(j)[i];
                }
            }
        }
        else
        {
            A.create(A0.dims == 3 ? A0.c : A0.h, A0.w, (size_t)4u, 1, opt.workspace_allocator);

            for (int i = 0; i < A.h; i++)
            {
                float* ptr = A.row(i);
                for (int j = 0; j < A.w; j++)
                {
                    ptr[j] = A0.dims == 3 ? A0.channel(j)[i] : A0.row(j)[i];
                }
            }
        }
    }

    // dynamic quantize A
    Mat A_int8 = A;
    Mat A_int8_scales = A_data_int8_scales;
    if (A_int8.elemsize != 1)
    {
        A_int8.create(A.w, A.dims == 3 ? A.c : A.h, (size_t)1u, 1, opt.workspace_allocator);
        A_int8_scales.create(A_int8.h, (size_t)4u, 1, opt.workspace_allocator);

        for (int i = 0; i < A_int8.h; i++)
        {
            const int A_hstep = A.dims == 3 ? (int)A.cstep : A.w;
            const float* ptr = (const float*)A + i * A_hstep;

            float absmax = 0.f;
            for (int k = 0; k < A_int8.w; k++)
            {
                absmax = std::max(absmax, (float)fabs(ptr[k]));
            }

            float A_int8_scale = absmax == 0.f ? 1.f : 127.f / absmax;
            A_int8_scales[i] = A_int8_scale;

            signed char* ptrAi = A_int8.row<signed char>(i);

            for (int k = 0; k < A_int8.w; k++)
            {
                ptrAi[k] = float2int8(ptr[k] * A_int8_scale);
            }
        }
    }

    // dynamic quantize B
    Mat B0_int8 = B0;
    float B_int8_scale = B_data_int8_scale;
    if (B0_int8.elemsize != 1)
    {
        B0_int8.create(B0.w, B0.dims == 3 ? B0.c : B0.h, (size_t)1u, 1, opt.workspace_allocator);

        float absmax = 0.f;
        for (int i = 0; i < B0_int8.h; i++)
        {
            const int B_hstep = B0.dims == 3 ? (int)B0.cstep : B0.w;
            const float* ptr = (const float*)B0 + i * B_hstep;

            for (int k = 0; k < B0_int8.w; k++)
            {
                absmax = std::max(absmax, (float)fabs(ptr[k]));
            }
        }

        B_int8_scale = absmax == 0.f ? 1.f : 127.f / absmax;

        for (int i = 0; i < B0_int8.h; i++)
        {
            const int B_hstep = B0.dims == 3 ? (int)B0.cstep : B0.w;
            const float* ptr = (const float*)B0 + i * B_hstep;

            signed char* ptrBi = B0_int8.row<signed char>(i);

            for (int k = 0; k < B0_int8.w; k++)
            {
                ptrBi[k] = float2int8(ptr[k] * B_int8_scale);
            }
        }
    }

    Mat BT_int8;
    if (transB == 0)
    {
        // transpose B to col-major
        BT_int8.create(B0_int8.h, B0_int8.w, (size_t)1u, 1, opt.workspace_allocator);

        for (int i = 0; i < BT_int8.h; i++)
        {
            signed char* ptr = BT_int8.row<signed char>(i);
            for (int j = 0; j < BT_int8.w; j++)
            {
                ptr[j] = B0_int8.row<const signed char>(j)[i];
            }
        }
    }
    else
    {
        BT_int8 = B0_int8;
    }

    const int M = A_int8.h;
    const int N = BT_int8.h;

    Mat C;
    int broadcast_type_C = 0;
    if (constantC)
    {
        C = C_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB && bottom_blobs.size() == 1)
        {
            C = bottom_blobs[0];
        }
        else if ((constantA || constantB) && bottom_blobs.size() == 2)
        {
            C = bottom_blobs[1];
        }
        else if (bottom_blobs.size() == 3)
        {
            C = bottom_blobs[2];
        }

        if (!C.empty())
        {
            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }
        }
    }

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N, 4u, opt.blob_allocator);
        else
            top_blob.create(M, N, 4u, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M, 4u, opt.blob_allocator);
        else
            top_blob.create(N, M, 4u, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    gemm_transB_int8(A_int8, BT_int8, A_int8_scales, B_int8_scale, C, top_blob, alpha, beta, broadcast_type_C, output_transpose, opt);

    return 0;
}